

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_error(lua_State *L)

{
  TValue *pTVar1;
  StkId pTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  lua_Integer lVar6;
  StkId o;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  TValue *pTVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  lVar6 = luaL_optinteger(L,2,1);
  auVar5 = _DAT_00115030;
  auVar4 = _DAT_00115020;
  auVar3 = _DAT_00115010;
  pTVar10 = L->top;
  pTVar1 = L->base;
  if (pTVar10 < pTVar1 + 1) {
    uVar8 = 0;
    uVar9 = (long)pTVar1 - (long)pTVar10;
    if (pTVar1 < pTVar10) {
      uVar9 = uVar8;
    }
    uVar9 = uVar9 + 0xf;
    auVar14._8_4_ = (int)uVar9;
    auVar14._0_8_ = uVar9;
    auVar14._12_4_ = (int)(uVar9 >> 0x20);
    auVar11._0_8_ = uVar9 >> 4;
    auVar11._8_8_ = auVar14._8_8_ >> 4;
    piVar7 = &pTVar10[3].tt;
    auVar11 = auVar11 ^ _DAT_00115030;
    do {
      auVar13._8_4_ = (int)uVar8;
      auVar13._0_8_ = uVar8;
      auVar13._12_4_ = (int)(uVar8 >> 0x20);
      auVar14 = (auVar13 | auVar4) ^ auVar5;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        piVar7[-0xc] = 0;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        piVar7[-8] = 0;
      }
      auVar14 = (auVar13 | auVar3) ^ auVar5;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar14._0_4_ <= auVar11._0_4_)) {
        piVar7[-4] = 0;
        *piVar7 = 0;
      }
      uVar8 = uVar8 + 4;
      piVar7 = piVar7 + 0x10;
    } while (((uVar9 >> 4) + 4 & 0xfffffffffffffffc) != uVar8);
  }
  L->top = pTVar1 + 1;
  if ((pTVar1 != &luaO_nilobject_) && (0 < (int)lVar6 && pTVar1->tt - 3U < 2)) {
    luaL_where(L,(int)lVar6);
    pTVar2 = L->top;
    pTVar10 = &luaO_nilobject_;
    if (L->base < pTVar2) {
      pTVar10 = L->base;
    }
    pTVar2->value = pTVar10->value;
    pTVar2->tt = pTVar10->tt;
    L->top = L->top + 1;
    lua_concat(L,2);
  }
  luaG_errormsg(L);
}

Assistant:

static int luaB_error(lua_State*L){
int level=luaL_optint(L,2,1);
lua_settop(L,1);
if(lua_isstring(L,1)&&level>0){
luaL_where(L,level);
lua_pushvalue(L,1);
lua_concat(L,2);
}
return lua_error(L);
}